

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O1

string * __thiscall
YAML::ScanTagHandle_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,bool *canBeHandle)

{
  bool bVar1;
  char cVar2;
  int n;
  RegEx *pRVar3;
  Exception *this_00;
  Mark local_68;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)&INPUT->m_input = 1;
  local_68.pos = 0;
  local_68.line = 0;
  local_68.column = 0;
  while( true ) {
    bVar1 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    cVar2 = Stream::peek((Stream *)this);
    if (cVar2 == '!') break;
    n = 0;
    if (*(char *)&INPUT->m_input != '\0') {
      pRVar3 = Exp::Word();
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = (size_type)this;
      n = RegEx::Match<YAML::StreamCharSource>(pRVar3,(StreamCharSource *)&local_58);
      if (n < 1) {
        *(undefined1 *)&INPUT->m_input = 0;
        local_68._0_8_ = *(undefined8 *)(this + 8);
        local_68.column = *(int *)(this + 0x10);
      }
    }
    if (*(char *)&INPUT->m_input == '\0') {
      pRVar3 = Exp::Tag();
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = (size_type)this;
      n = RegEx::Match<YAML::StreamCharSource>(pRVar3,(StreamCharSource *)&local_58);
    }
    if (n < 1) {
      return __return_storage_ptr__;
    }
    Stream::get_abi_cxx11_(&local_58,(Stream *)this,n);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (n < 1) {
      return __return_storage_ptr__;
    }
  }
  if (*(char *)&INPUT->m_input != '\0') {
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x40);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"illegal character found while scanning tag handle","");
  Exception::Exception(this_00,&local_68,&local_58);
  *(undefined ***)this_00 = &PTR__BadFile_008899d0;
  __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

const std::string ScanTagHandle(Stream& INPUT, bool& canBeHandle) {
  std::string tag;
  canBeHandle = true;
  Mark firstNonWordChar;

  while (INPUT) {
    if (INPUT.peek() == Keys::Tag) {
      if (!canBeHandle)
        throw ParserException(firstNonWordChar, ErrorMsg::CHAR_IN_TAG_HANDLE);
      break;
    }

    int n = 0;
    if (canBeHandle) {
      n = Exp::Word().Match(INPUT);
      if (n <= 0) {
        canBeHandle = false;
        firstNonWordChar = INPUT.mark();
      }
    }

    if (!canBeHandle)
      n = Exp::Tag().Match(INPUT);

    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  return tag;
}